

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedSSOSubroutine::Run(AdvancedSSOSubroutine *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  GLuint GVar4;
  bool bVar5;
  GLint GVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  reference pvVar10;
  float *pfVar11;
  CallLogWrapper *this_00;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  undefined1 local_e8 [8];
  vec4 c_1;
  int w_1;
  int h_1;
  int layer_1;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  undefined4 local_8c;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined1 local_68 [8];
  vec4 c;
  int w;
  int h;
  int layer;
  allocator<tcu::Vector<float,_4>_> local_39;
  undefined1 local_38 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint indices [2];
  AdvancedSSOSubroutine *this_local;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar4 = this->m_program;
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image0");
  glu::CallLogWrapper::glProgramUniform1i(this_00,GVar4,GVar6,1);
  GVar4 = this->m_program;
  GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_image1");
  glu::CallLogWrapper::glProgramUniform1i(this_00,GVar4,GVar6,1);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2601);
  iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  iVar8 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x8c1a,0,0x8814,iVar7,iVar8,3,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glGetIntegerv(this_00,0xc01,&this->m_draw_buffer);
  glu::CallLogWrapper::glDrawBuffer(this_00,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,0,'\x01',0,0x88ba,0x8814);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       glu::CallLogWrapper::glGetSubroutineIndex(this_00,this->m_program,0x8b30,"Brush0");
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       glu::CallLogWrapper::glGetSubroutineIndex(this_00,this->m_program,0x8b30,"Brush1");
  glu::CallLogWrapper::glUniformSubroutinesuiv
            (this_00,0x8b30,1,
             (GLuint *)
             &data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glDrawArraysInstancedBaseInstance(this_00,4,0,3,1,0);
  iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  iVar8 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_39);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38,
             (long)(iVar7 * iVar8 * 3),&local_39);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_39);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x100);
  pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_38,0);
  glu::CallLogWrapper::glGetTexImage
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0,0x1908,0x1406,pvVar10);
  w = 0;
  do {
    if (2 < w) {
      glu::CallLogWrapper::glUniformSubroutinesuiv
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8b30,1,
                 (GLuint *)
                 ((long)&data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,0,3,1,0);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x100);
      pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_38,0);
      glu::CallLogWrapper::glGetTexImage
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c1a,0,0x1908,0x1406,pvVar10);
      for (w_1 = 0; w_1 < 3; w_1 = w_1 + 1) {
        c_1.m_data[3] = 0.0;
        while( true ) {
          fVar1 = c_1.m_data[3];
          iVar7 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
          if (iVar7 <= (int)fVar1) break;
          c_1.m_data[2] = 0.0;
          while( true ) {
            fVar1 = c_1.m_data[2];
            iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
            if (iVar7 <= (int)fVar1) break;
            iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
            iVar8 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase)
            ;
            fVar1 = c_1.m_data[3];
            iVar9 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
            pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)local_38,
                                 (long)(w_1 * iVar7 * iVar8 + (int)fVar1 * iVar9 +
                                       (int)c_1.m_data[2]));
            tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e8,pvVar10);
            if (w_1 == 0) {
              tcu::Vector<float,_4>::Vector(&local_f8,(Vector<float,_4> *)local_e8);
              tcu::Vector<float,_4>::Vector(&local_108,0.0,1.0,0.0,1.0);
              bVar5 = ShaderImageLoadStoreBase::IsEqual
                                (&this->super_ShaderImageLoadStoreBase,&local_f8,&local_108);
              if (!bVar5) {
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,0);
                fVar1 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,1);
                fVar2 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,2);
                fVar3 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,3);
                anon_unknown_0::Output
                          ("Color is (%f %f %f %f) should be (0 1 0 1)\n",(double)fVar1,
                           (double)fVar2,(double)fVar3,(double)*pfVar11);
                this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
                goto LAB_01093fe0;
              }
            }
            if (w_1 == 1) {
              tcu::Vector<float,_4>::Vector(&local_118,(Vector<float,_4> *)local_e8);
              tcu::Vector<float,_4>::Vector(&local_128,0.0,0.0,1.0,1.0);
              bVar5 = ShaderImageLoadStoreBase::IsEqual
                                (&this->super_ShaderImageLoadStoreBase,&local_118,&local_128);
              if (!bVar5) {
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,0);
                fVar1 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,1);
                fVar2 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,2);
                fVar3 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,3);
                anon_unknown_0::Output
                          ("Color is (%f %f %f %f) should be (0 0 1 1)\n",(double)fVar1,
                           (double)fVar2,(double)fVar3,(double)*pfVar11);
                this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
                goto LAB_01093fe0;
              }
            }
            if (w_1 == 2) {
              tcu::Vector<float,_4>::Vector(&local_138,(Vector<float,_4> *)local_e8);
              tcu::Vector<float,_4>::Vector(&local_148,1.0,0.0,0.0,1.0);
              bVar5 = ShaderImageLoadStoreBase::IsEqual
                                (&this->super_ShaderImageLoadStoreBase,&local_138,&local_148);
              if (!bVar5) {
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,0);
                fVar1 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,1);
                fVar2 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,2);
                fVar3 = *pfVar11;
                pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_e8,3);
                anon_unknown_0::Output
                          ("Color is (%f %f %f %f) should be (1 0 0 1)\n",(double)fVar1,
                           (double)fVar2,(double)fVar3,(double)*pfVar11);
                this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
                goto LAB_01093fe0;
              }
            }
            c_1.m_data[2] = (float)((int)c_1.m_data[2] + 1);
          }
          c_1.m_data[3] = (float)((int)c_1.m_data[3] + 1);
        }
      }
      this_local = (AdvancedSSOSubroutine *)0x0;
LAB_01093fe0:
      local_8c = 1;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38)
      ;
      return (long)this_local;
    }
    c.m_data[3] = 0.0;
    while( true ) {
      fVar1 = c.m_data[3];
      iVar7 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
      if (iVar7 <= (int)fVar1) break;
      c.m_data[2] = 0.0;
      while( true ) {
        fVar1 = c.m_data[2];
        iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
        if (iVar7 <= (int)fVar1) break;
        iVar7 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
        iVar8 = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
        fVar1 = c.m_data[3];
        iVar9 = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
        pvVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_38,
                             (long)(w * iVar7 * iVar8 + (int)fVar1 * iVar9 + (int)c.m_data[2]));
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_68,pvVar10);
        if (w == 0) {
          tcu::Vector<float,_4>::Vector(&local_78,(Vector<float,_4> *)local_68);
          tcu::Vector<float,_4>::Vector(&local_88,1.0,0.0,0.0,1.0);
          bVar5 = ShaderImageLoadStoreBase::IsEqual
                            (&this->super_ShaderImageLoadStoreBase,&local_78,&local_88);
          if (!bVar5) {
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,0);
            fVar1 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,1);
            fVar2 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,2);
            fVar3 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,3);
            anon_unknown_0::Output
                      ("Color is (%f %f %f %f) should be (1 0 0 1)\n",(double)fVar1,(double)fVar2,
                       (double)fVar3,(double)*pfVar11);
            this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
            goto LAB_01093fe0;
          }
        }
        if (w == 1) {
          tcu::Vector<float,_4>::Vector(&local_9c,(Vector<float,_4> *)local_68);
          tcu::Vector<float,_4>::Vector(&local_ac,0.0,1.0,0.0,1.0);
          bVar5 = ShaderImageLoadStoreBase::IsEqual
                            (&this->super_ShaderImageLoadStoreBase,&local_9c,&local_ac);
          if (!bVar5) {
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,0);
            fVar1 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,1);
            fVar2 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,2);
            fVar3 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,3);
            anon_unknown_0::Output
                      ("Color is (%f %f %f %f) should be (0 1 0 1)\n",(double)fVar1,(double)fVar2,
                       (double)fVar3,(double)*pfVar11);
            this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
            goto LAB_01093fe0;
          }
        }
        if (w == 2) {
          tcu::Vector<float,_4>::Vector(&local_bc,(Vector<float,_4> *)local_68);
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&h_1,0.0,0.0,1.0,1.0);
          bVar5 = ShaderImageLoadStoreBase::IsEqual
                            (&this->super_ShaderImageLoadStoreBase,&local_bc,(vec4 *)&h_1);
          if (!bVar5) {
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,0);
            fVar1 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,1);
            fVar2 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,2);
            fVar3 = *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_68,3);
            anon_unknown_0::Output
                      ("Color is (%f %f %f %f) should be (0 0 1 1)\n",(double)fVar1,(double)fVar2,
                       (double)fVar3,(double)*pfVar11);
            this_local = (AdvancedSSOSubroutine *)&DAT_ffffffffffffffff;
            goto LAB_01093fe0;
          }
        }
        c.m_data[2] = (float)((int)c.m_data[2] + 1);
      }
      c.m_data[3] = (float)((int)c.m_data[3] + 1);
    }
    w = w + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image0"), 1);
		glProgramUniform1i(m_program, glGetUniformLocation(m_program, "g_image1"), 1);

		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, getWindowWidth(), getWindowHeight(), 3, 0, GL_RGBA, GL_FLOAT,
					 NULL);

		glGetIntegerv(GL_DRAW_BUFFER, &m_draw_buffer);

		glDrawBuffer(GL_NONE);
		glBindImageTexture(1, m_texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_RGBA32F);
		glUseProgram(m_program);
		glBindVertexArray(m_attribless_vao);

		const GLuint indices[2] = { glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush0"),
									glGetSubroutineIndex(m_program, GL_FRAGMENT_SHADER, "Brush1") };

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[0]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		std::vector<vec4> data(getWindowWidth() * getWindowHeight() * 3);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}

		glUniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &indices[1]);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);

		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, GL_FLOAT, &data[0]);

		for (int layer = 0; layer < 3; ++layer)
		{
			for (int h = 0; h < getWindowHeight(); ++h)
			{
				for (int w = 0; w < getWindowWidth(); ++w)
				{
					const vec4 c = data[layer * getWindowWidth() * getWindowHeight() + h * getWindowWidth() + w];
					if (layer == 0 && !IsEqual(c, vec4(0.0f, 1.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 1 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 1 && !IsEqual(c, vec4(0.0f, 0.0f, 1.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (0 0 1 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
					else if (layer == 2 && !IsEqual(c, vec4(1.0f, 0.0f, 0.0f, 1.0f)))
					{
						Output("Color is (%f %f %f %f) should be (1 0 0 1)\n", c[0], c[1], c[2], c[3]);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}